

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,rect<int> *destRect,rect<int> *clip,SColor *colors,
          u32 timeTicks,bool loop)

{
  uint uVar1;
  pointer prVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  u32 frame;
  u32 local_34;
  
  local_34 = 0;
  bVar3 = getFrameNr(this,&local_34,index,timeTicks,loop);
  if (bVar3) {
    iVar4 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                      (this,(ulong)*(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).
                                                                 field_0x8 + (ulong)index * 0x28) +
                                            (ulong)local_34 * 8));
    if (CONCAT44(extraout_var,iVar4) != 0) {
      prVar2 = (this->Rectangles).m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 +
                                 (ulong)index * 0x28) + 4 + (ulong)local_34 * 8);
      if (uVar1 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar2) >>
                        4)) {
        (*this->Driver->_vptr_IVideoDriver[0x32])
                  (this->Driver,CONCAT44(extraout_var,iVar4),destRect,prVar2 + uVar1,clip,colors,1);
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::rect<s32> &destRect,
		const core::rect<s32> *clip, const video::SColor *const colors,
		u32 timeTicks, bool loop)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, timeTicks, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	Driver->draw2DImage(tex, destRect, Rectangles[rn], clip, colors, true);
}